

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateBufferVariableMatrixCaseBlocks
               (Context *context,TestCaseGroup *targetGroup,GLSLVersion glslVersion,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_bool *blockContentGenerator)

{
  Program *this;
  Shader *this_00;
  Node *ptr;
  StorageQualifier *this_01;
  TestCaseGroup *this_02;
  LayoutQualifier *this_03;
  InterfaceBlock *this_04;
  SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
  local_d0;
  SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
  local_c0;
  undefined1 local_ac [8];
  Layout layout;
  TestCaseGroup *blockGroup;
  SharedPtr parentStructure;
  undefined1 local_78 [4];
  int childNdx;
  SharedPtr buffer;
  SharedPtr defaultBlock;
  SharedPtr shader;
  undefined1 local_38 [8];
  SharedPtr program;
  _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_bool *blockContentGenerator_local;
  GLSLVersion glslVersion_local;
  TestCaseGroup *targetGroup_local;
  Context *context_local;
  
  program.m_state = (SharedPtrStateBase *)blockContentGenerator;
  this = (Program *)operator_new(0x28);
  ResourceDefinition::Program::Program(this,false);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_38,(Node *)this);
  this_00 = (Shader *)operator_new(0x28);
  ResourceDefinition::Shader::Shader(this_00,(SharedPtr *)local_38,SHADERTYPE_COMPUTE,glslVersion);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&defaultBlock.m_state,(Node *)this_00);
  ptr = (Node *)operator_new(0x20);
  ResourceDefinition::DefaultBlock::DefaultBlock
            ((DefaultBlock *)ptr,(SharedPtr *)&defaultBlock.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&buffer.m_state,ptr);
  this_01 = (StorageQualifier *)operator_new(0x28);
  ResourceDefinition::StorageQualifier::StorageQualifier
            (this_01,(SharedPtr *)&buffer.m_state,STORAGE_BUFFER);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_78,(Node *)this_01);
  for (parentStructure.m_state._4_4_ = 0; parentStructure.m_state._4_4_ < 6;
      parentStructure.m_state._4_4_ = parentStructure.m_state._4_4_ + 1) {
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&blockGroup,
              (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_78);
    this_02 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup
              (this_02,context,
               generateBufferVariableMatrixCaseBlocks::children[parentStructure.m_state._4_4_].name,
               generateBufferVariableMatrixCaseBlocks::children[parentStructure.m_state._4_4_].
               description);
    layout._12_8_ = this_02;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)this_02);
    if (generateBufferVariableMatrixCaseBlocks::children[parentStructure.m_state._4_4_].order !=
        MATRIXORDER_LAST) {
      glu::Layout::Layout((Layout *)local_ac,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      layout.offset =
           generateBufferVariableMatrixCaseBlocks::children[parentStructure.m_state._4_4_].order;
      this_03 = (LayoutQualifier *)operator_new(0x38);
      ResourceDefinition::LayoutQualifier::LayoutQualifier
                (this_03,(SharedPtr *)&blockGroup,(Layout *)local_ac);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&local_c0,(Node *)this_03);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::operator=((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)&blockGroup,&local_c0);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&local_c0);
    }
    this_04 = (InterfaceBlock *)operator_new(0x28);
    ResourceDefinition::InterfaceBlock::InterfaceBlock
              (this_04,(SharedPtr *)&blockGroup,
               (bool)(generateBufferVariableMatrixCaseBlocks::children
                      [parentStructure.m_state._4_4_].namedBlock & 1));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&local_d0,(Node *)this_04);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    operator=((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&blockGroup,&local_d0);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&local_d0);
    (*(code *)program.m_state)
              (context,&blockGroup,layout._12_8_,
               generateBufferVariableMatrixCaseBlocks::children[parentStructure.m_state._4_4_].
               extendedBasicTypeCases & 1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&blockGroup);
  }
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_78);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&buffer.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&defaultBlock.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_38);
  return;
}

Assistant:

static void generateBufferVariableMatrixCaseBlocks (Context& context, tcu::TestCaseGroup* const targetGroup, glu::GLSLVersion glslVersion, void (*blockContentGenerator)(Context&, const ResourceDefinition::Node::SharedPtr&, tcu::TestCaseGroup*, bool))
{
	static const struct
	{
		const char*			name;
		const char*			description;
		bool				namedBlock;
		bool				extendedBasicTypeCases;
		glu::MatrixOrder	order;
	} children[] =
	{
		{ "named_block",				"Named uniform block",		true,	true,	glu::MATRIXORDER_LAST			},
		{ "named_block_row_major",		"Named uniform block",		true,	false,	glu::MATRIXORDER_ROW_MAJOR		},
		{ "named_block_col_major",		"Named uniform block",		true,	false,	glu::MATRIXORDER_COLUMN_MAJOR	},
		{ "unnamed_block",				"Unnamed uniform block",	false,	false,	glu::MATRIXORDER_LAST			},
		{ "unnamed_block_row_major",	"Unnamed uniform block",	false,	false,	glu::MATRIXORDER_ROW_MAJOR		},
		{ "unnamed_block_col_major",	"Unnamed uniform block",	false,	false,	glu::MATRIXORDER_COLUMN_MAJOR	},
	};

	const ResourceDefinition::Node::SharedPtr	program			(new ResourceDefinition::Program());
	const ResourceDefinition::Node::SharedPtr	shader			(new ResourceDefinition::Shader(program, glu::SHADERTYPE_COMPUTE, glslVersion));
	const ResourceDefinition::Node::SharedPtr	defaultBlock	(new ResourceDefinition::DefaultBlock(shader));
	const ResourceDefinition::Node::SharedPtr	buffer			(new ResourceDefinition::StorageQualifier(defaultBlock, glu::STORAGE_BUFFER));

	for (int childNdx = 0; childNdx < (int)DE_LENGTH_OF_ARRAY(children); ++childNdx)
	{
		ResourceDefinition::Node::SharedPtr	parentStructure	= buffer;
		tcu::TestCaseGroup* const			blockGroup		= new TestCaseGroup(context, children[childNdx].name, children[childNdx].description);

		targetGroup->addChild(blockGroup);

		if (children[childNdx].order != glu::MATRIXORDER_LAST)
		{
			glu::Layout layout;
			layout.matrixOrder = children[childNdx].order;
			parentStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::LayoutQualifier(parentStructure, layout));
		}

		parentStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::InterfaceBlock(parentStructure, children[childNdx].namedBlock));

		blockContentGenerator(context, parentStructure, blockGroup, children[childNdx].extendedBasicTypeCases);
	}
}